

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hh
# Opt level: O2

Module * __thiscall hgdb::json::SymbolTable::add_module(SymbolTable *this,string *name)

{
  Module *pMVar1;
  reference pvVar2;
  pointer *__ptr;
  _Alloc_hider local_28;
  SymbolTable *local_20;
  
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_emplace_unique<std::__cxx11::string_const&>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&this->top_names_,name);
  local_20 = this;
  std::
  make_unique<hgdb::json::Module,std::__cxx11::string_const&,hgdb::json::SymbolTable::add_module(std::__cxx11::string_const&)::_lambda(std::__cxx11::string_const&)_1_>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_28,
             (anon_class_8_1_8991fb9c *)name);
  pvVar2 = std::
           vector<std::unique_ptr<hgdb::json::Module,std::default_delete<hgdb::json::Module>>,std::allocator<std::unique_ptr<hgdb::json::Module,std::default_delete<hgdb::json::Module>>>>
           ::
           emplace_back<std::unique_ptr<hgdb::json::Module,std::default_delete<hgdb::json::Module>>>
                     ((vector<std::unique_ptr<hgdb::json::Module,std::default_delete<hgdb::json::Module>>,std::allocator<std::unique_ptr<hgdb::json::Module,std::default_delete<hgdb::json::Module>>>>
                       *)&this->modules_,
                      (unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_> *)
                      &local_28);
  pMVar1 = (pvVar2->_M_t).
           super___uniq_ptr_impl<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>._M_t.
           super__Tuple_impl<0UL,_hgdb::json::Module_*,_std::default_delete<hgdb::json::Module>_>.
           super__Head_base<0UL,_hgdb::json::Module_*,_false>._M_head_impl;
  if ((long *)local_28._M_p != (long *)0x0) {
    (**(code **)(*(long *)local_28._M_p + 0x10))();
  }
  return pMVar1;
}

Assistant:

Module *add_module(const std::string &name) {
        // no error check
        top_names_.emplace(name);
        return modules_
            .emplace_back(std::make_unique<Module>(
                name, [this](const std::string &name) { remove_module_top(name); }))
            .get();
    }